

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateL2NormLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  bool bVar1;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  string local_50;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)local_98,layer,1,1);
  __return_storage_ptr__->m_type = local_98._0_4_;
  __return_storage_ptr__->m_reason = local_98._4_4_;
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
  }
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount((Result *)local_98,layer,1,1);
    __return_storage_ptr__->m_type = local_98._0_4_;
    __return_storage_ptr__->m_reason = local_98._4_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
  }
  bVar1 = Result::good(__return_storage_ptr__);
  if ((bVar1) && (this->ndArrayInterpretation == true)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"L2Normalize","");
    validateInputOutputRankEquality((Result *)local_98,layer,&local_70,&this->blobNameToRank);
    __return_storage_ptr__->m_type = local_98._0_4_;
    __return_storage_ptr__->m_reason = local_98._4_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"L2Normalize","");
      validateRankCount((Result *)local_98,layer,&local_50,3,-1,&this->blobNameToRank);
      __return_storage_ptr__->m_type = local_98._0_4_;
      __return_storage_ptr__->m_reason = local_98._4_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_p != &local_80) {
        operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      Result::good(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateL2NormLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "L2Normalize", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "L2Normalize", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    return r;
}